

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 VmEnterFrame(jx9_vm *pVm,void *pUserData,VmFrame **ppFrame)

{
  sxi32 sVar1;
  VmFrame *__s;
  ProcCmp in_RCX;
  ProcHash xHash;
  VmFrame *pVVar2;
  
  __s = (VmFrame *)SyMemBackendPoolAlloc(&pVm->sAllocator,0xb0);
  pVVar2 = (VmFrame *)0x0;
  if (__s != (VmFrame *)0x0) {
    memset(__s,0,0xb0);
    __s->pUserData = pUserData;
    __s->pVm = pVm;
    SyHashInit(&__s->hVar,&pVm->sAllocator,xHash,in_RCX);
    (__s->sArg).nSize = 0;
    (__s->sArg).eSize = 0x10;
    (__s->sArg).nUsed = 0;
    (__s->sArg).nCursor = 0;
    (__s->sArg).pAllocator = &pVm->sAllocator;
    (__s->sArg).pBase = (void *)0x0;
    (__s->sArg).pUserData = (void *)0x0;
    (__s->sLocal).eSize = 0x10;
    (__s->sLocal).nCursor = 0;
    (__s->sLocal).pAllocator = &pVm->sAllocator;
    (__s->sLocal).pBase = (void *)0x0;
    (__s->sLocal).nUsed = 0;
    (__s->sLocal).nSize = 0;
    (__s->sLocal).pUserData = (void *)0x0;
    pVVar2 = __s;
  }
  if (pVVar2 == (VmFrame *)0x0) {
    sVar1 = -1;
  }
  else {
    pVVar2->pParent = pVm->pFrame;
    pVm->pFrame = pVVar2;
    sVar1 = 0;
    if (ppFrame != (VmFrame **)0x0) {
      *ppFrame = pVVar2;
      sVar1 = 0;
    }
  }
  return sVar1;
}

Assistant:

static sxi32 VmEnterFrame(
	jx9_vm *pVm,               /* Target VM */
	void *pUserData,           /* Upper-layer private data */
	VmFrame **ppFrame          /* OUT: Top most active frame */
	)
{
	VmFrame *pFrame;
	/* Allocate a new frame */
	pFrame = VmNewFrame(&(*pVm), pUserData);
	if( pFrame == 0 ){
		return SXERR_MEM;
	}
	/* Link to the list of active VM frame */
	pFrame->pParent = pVm->pFrame;
	pVm->pFrame = pFrame;
	if( ppFrame ){
		/* Write a pointer to the new VM frame */
		*ppFrame = pFrame;
	}
	return SXRET_OK;
}